

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::paintEvent(DateTimePicker *this,QPaintEvent *param_1)

{
  int awidth;
  int aleft;
  DateTimePickerPrivate *pDVar1;
  long lVar2;
  qsizetype qVar3;
  const_reference pSVar4;
  QPalette *this_00;
  QColor *baseColor;
  undefined1 local_88 [8];
  QRect r;
  int i;
  int x;
  QPainter p;
  QStyleOption local_58 [8];
  QStyleOption opt;
  QPaintEvent *param_1_local;
  DateTimePicker *this_local;
  
  pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  DateTimePickerPrivate::normalizeOffsets(pDVar1);
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  QPainter::QPainter((QPainter *)&i,(QPaintDevice *)&this->field_0x10);
  r.y2 = 0;
  r.x2 = 0;
  while( true ) {
    lVar2 = (long)r.x2;
    pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    qVar3 = QList<QtMWidgets::Section>::size(&(pDVar1->super_DateTimeParser).sections);
    aleft = r.y2;
    if (qVar3 <= lVar2) break;
    pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pSVar4 = QList<QtMWidgets::Section>::at(&(pDVar1->super_DateTimeParser).sections,(long)r.x2);
    awidth = pSVar4->sectionWidth;
    pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    QRect::QRect((QRect *)local_88,aleft,0,awidth,pDVar1->widgetHeight);
    this_00 = (QPalette *)QWidget::palette();
    baseColor = QPalette::color(this_00,Dark);
    lVar2 = (long)r.x2;
    pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    qVar3 = QList<QtMWidgets::Section>::size(&(pDVar1->super_DateTimeParser).sections);
    drawCylinder((QPainter *)&i,(QRect *)local_88,baseColor,lVar2 == 0,lVar2 == qVar3 + -1);
    pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    DateTimePickerPrivate::drawSectionItems(pDVar1,r.x2,(QPainter *)&i,local_58);
    pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pSVar4 = QList<QtMWidgets::Section>::at(&(pDVar1->super_DateTimeParser).sections,(long)r.x2);
    r.y2 = pSVar4->sectionWidth + r.y2;
    r.x2 = r.x2 + 1;
  }
  pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  DateTimePickerPrivate::drawWindow(pDVar1,(QPainter *)&i,local_58);
  QPainter::~QPainter((QPainter *)&i);
  QStyleOption::~QStyleOption(local_58);
  return;
}

Assistant:

void
DateTimePicker::paintEvent( QPaintEvent * )
{
	d->normalizeOffsets();

	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	int x = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		const QRect r( x, 0, d->sections.at( i ).sectionWidth, d->widgetHeight );

		drawCylinder( &p, r, palette().color( QPalette::Dark ),
			( i == 0 ), ( i == d->sections.size() - 1 ) );

		d->drawSectionItems( i, &p, opt );

		x += d->sections.at( i ).sectionWidth;
	}

	d->drawWindow( &p, opt );
}